

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void empty_readdir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  int r;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  pvVar1 = readdir_req.ptr;
  if (req != &readdir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x3d,"req == &readdir_req");
    abort();
  }
  if (readdir_req.fs_type != UV_FS_READDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x3e,"req->fs_type == UV_FS_READDIR");
    abort();
  }
  if (readdir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x3f,"req->result == 0");
    abort();
  }
  uv_fs_req_cleanup(&readdir_req);
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_closedir(uVar3,&closedir_req,pvVar1,empty_closedir_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x46,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &readdir_req);
  ASSERT(req->fs_type == UV_FS_READDIR);
  ASSERT(req->result == 0);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT(r == 0);
}